

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

QFont * __thiscall QCommandLinkButtonPrivate::descriptionFont(QCommandLinkButtonPrivate *this)

{
  undefined4 uVar1;
  QWidget *this_00;
  QFont *pQVar2;
  QCommandLinkButtonPrivate *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  int resolve_mask;
  QCommandLinkButton *q;
  QFont *modifiedFont;
  QFont font;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(in_RSI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QWidget::font(this_00);
  QFont::QFont((QFont *)&local_18,pQVar2);
  QFont::setPointSizeF(9.0);
  uVar1 = local_10._0_4_;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 8) = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::font(this_00);
  QFont::resolve(in_RDI);
  QFont::detach();
  *(undefined4 *)(in_RDI + 8) = uVar1;
  QFont::~QFont((QFont *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QFont QCommandLinkButtonPrivate::descriptionFont() const
{
    Q_Q(const QCommandLinkButton);
    QFont font = q->font();
    font.setPointSizeF(9.0);

    // Note the font will be resolved against
    // QPainters font, so we need to restore the mask
    int resolve_mask = font.resolve_mask;
    QFont modifiedFont = q->font().resolve(font);
    modifiedFont.detach();
    modifiedFont.resolve_mask = resolve_mask;
    return modifiedFont;
}